

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forest_device.cpp
# Opt level: O1

void embree::update_instance_transforms(void)

{
  long lVar1;
  ulong uVar2;
  
  if (g_use_instance_array) {
    rtcUpdateGeometryBuffer(instance_array,0x17,0);
    rtcCommitGeometry(instance_array);
    return;
  }
  if (num_trees != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      rtcSetGeometryTransform(*(undefined8 *)(instances + uVar2 * 8),0,0x9244,DAT_002e9ee0 + lVar1);
      rtcCommitGeometry(*(undefined8 *)(instances + uVar2 * 8));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x40;
    } while (uVar2 < num_trees);
  }
  return;
}

Assistant:

void update_instance_transforms()
{
  if (g_use_instance_array)
  {
    rtcUpdateGeometryBuffer(instance_array, RTC_BUFFER_TYPE_TRANSFORM, 0);
    rtcCommitGeometry(instance_array);
  }
  else
  {
    for (unsigned int i = 0; i < num_trees; ++i) {
      rtcSetGeometryTransform(instances[i],0,RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR,(float*)&data.tree_transforms_host[i]);
      rtcCommitGeometry(instances[i]);
    }
  }
}